

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseNat(WastParser *this,uint64_t *out_nat)

{
  anon_union_16_2_ecfd7102_for_Location_1 *paVar1;
  Location loc;
  TokenType TVar2;
  Result RVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  Token token;
  Token local_88;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  TVar2 = Peek(this,0);
  if (TVar2 == Last_Literal) {
    Consume(&local_88,this);
    if (2 < local_88.token_type_ - First_Literal) {
      __assert_fail("HasLiteral()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/token.h"
                    ,0x71,"const Literal &wabt::Token::literal() const");
    }
    RVar3 = ParseUint64(local_88.field_2.literal_.text.data_,
                        local_88.field_2.literal_.text.data_ + local_88.field_2.literal_.text.size_,
                        out_nat);
    if ((RVar3.enum_ == Error) || (*(int *)((long)out_nat + 4) != 0)) {
      loc.filename.size_._0_4_ = (undefined4)local_88.loc.filename.size_;
      loc.filename.data_ = local_88.loc.filename.data_;
      loc.filename.size_._4_4_ = local_88.loc.filename.size_._4_4_;
      loc.field_1.field_0.line = local_88.loc.field_1.field_0.line;
      loc.field_1.field_0.first_column = local_88.loc.field_1.field_0.first_column;
      loc.field_1.field_0.last_column = local_88.loc.field_1.field_0.last_column;
      loc.field_1._12_4_ = local_88.loc.field_1._12_4_;
      Error(this,loc,"invalid int \"%.*s\"",local_88.field_2.literal_.text.size_ & 0xffffffff,
            local_88.field_2.text_.size_,in_R8,in_R9);
    }
    RVar3.enum_ = Ok;
  }
  else {
    paVar1 = &local_88.loc.field_1;
    local_88.loc.filename.data_ = (char *)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"a natural number","");
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               &local_88,&local_88.token_type_);
    RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_48,"123");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_88.loc.filename.data_ != paVar1) {
      operator_delete(local_88.loc.filename.data_);
    }
  }
  return (Result)RVar3.enum_;
}

Assistant:

Result WastParser::ParseNat(uint64_t* out_nat) {
  WABT_TRACE(ParseNat);
  if (!PeekMatch(TokenType::Nat)) {
    return ErrorExpected({"a natural number"}, "123");
  }

  Token token = Consume();
  string_view sv = token.literal().text;
  if (Failed(ParseUint64(sv.begin(), sv.end(), out_nat)) ||
      *out_nat > 0xffffffffu) {
    Error(token.loc, "invalid int \"" PRIstringview "\"",
          WABT_PRINTF_STRING_VIEW_ARG(sv));
  }

  return Result::Ok;
}